

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

bool __thiscall CCoinsViewCache::SpendCoin(CCoinsViewCache *this,COutPoint *outpoint,Coin *moveout)

{
  Coin *this_00;
  long lVar1;
  iterator __it;
  size_t sVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __it = FetchCoin(this,outpoint);
  if (__it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur !=
      (__node_type *)0x0) {
    this_00 = (Coin *)((long)__it.
                             super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                             ._M_cur + 0x48);
    sVar2 = Coin::DynamicMemoryUsage(this_00);
    this->cachedCoinsUsage = this->cachedCoinsUsage - sVar2;
    if (moveout != (Coin *)0x0) {
      Coin::operator=(moveout,this_00);
    }
    if ((*(byte *)((long)__it.
                         super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                         ._M_cur + 0x40) & 2) == 0) {
      CCoinsCacheEntry::AddFlags
                ((CCoinsCacheEntry *)
                 ((long)__it.
                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                        ._M_cur + 0x30),'\x01',
                 (CoinsCachePair *)
                 ((long)__it.
                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                        ._M_cur + 8),&this->m_sentinel);
      Coin::Clear(this_00);
    }
    else {
      std::
      _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->cacheCoins)._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
           _M_cur != (__node_type *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::SpendCoin(const COutPoint &outpoint, Coin* moveout) {
    CCoinsMap::iterator it = FetchCoin(outpoint);
    if (it == cacheCoins.end()) return false;
    cachedCoinsUsage -= it->second.coin.DynamicMemoryUsage();
    TRACE5(utxocache, spent,
           outpoint.hash.data(),
           (uint32_t)outpoint.n,
           (uint32_t)it->second.coin.nHeight,
           (int64_t)it->second.coin.out.nValue,
           (bool)it->second.coin.IsCoinBase());
    if (moveout) {
        *moveout = std::move(it->second.coin);
    }
    if (it->second.IsFresh()) {
        cacheCoins.erase(it);
    } else {
        it->second.AddFlags(CCoinsCacheEntry::DIRTY, *it, m_sentinel);
        it->second.coin.Clear();
    }
    return true;
}